

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O0

void __thiscall QPMCache::resizeKeyArray(QPMCache *this,int size)

{
  int *piVar1;
  int in_ESI;
  long in_RDI;
  int i;
  int local_10;
  
  if ((*(int *)(in_RDI + 0x68) < in_ESI) && (in_ESI != 0)) {
    realloc(*(void **)(in_RDI + 0x58),(long)in_ESI << 2);
    piVar1 = q_check_ptr<int>((int *)0x327e8a);
    *(int **)(in_RDI + 0x58) = piVar1;
    for (local_10 = *(int *)(in_RDI + 0x68); local_10 != in_ESI; local_10 = local_10 + 1) {
      *(int *)(*(long *)(in_RDI + 0x58) + (long)local_10 * 4) = local_10 + 1;
    }
    *(int *)(in_RDI + 0x68) = in_ESI;
  }
  return;
}

Assistant:

void QPMCache::resizeKeyArray(int size)
{
    if (size <= keyArraySize || size == 0)
        return;
    keyArray = q_check_ptr(static_cast<int *>(realloc(keyArray,
                    size * sizeof(int))));
    for (int i = keyArraySize; i != size; ++i)
        keyArray[i] = i + 1;
    keyArraySize = size;
}